

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O0

int http_MakeMessage(membuffer *buf,int http_major_version,int http_minor_version,char *fmt,...)

{
  char cVar1;
  uint uVar2;
  UpnpListHead *pUVar3;
  char in_AL;
  int iVar4;
  UpnpListIter pUVar5;
  SendInstruction *__s;
  size_t sVar6;
  tm *ptVar7;
  char *pcVar8;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 in_stack_fffffffffffff9b0;
  undefined4 uVar9;
  size_t in_stack_fffffffffffff9b8;
  undefined4 uVar10;
  char *in_stack_fffffffffffff9c0;
  undefined4 uVar11;
  undefined8 in_stack_fffffffffffff9c8;
  undefined4 uVar12;
  char *in_stack_fffffffffffff9d0;
  undefined4 uVar13;
  unsigned_long *local_620;
  undefined8 *local_608;
  uint *local_5f0;
  undefined8 *local_5d8;
  undefined8 *local_5c0;
  http_method_t *local_5a8;
  uint *local_580;
  uint *local_568;
  undefined8 *local_540;
  long *local_528;
  long *local_510;
  time_t *local_4e8;
  undefined8 *local_4c0;
  int *local_498;
  size_t *local_480;
  undefined8 *local_468;
  long *local_440;
  long *local_428;
  undefined8 *local_400;
  undefined8 *local_3d0;
  http_method_t local_3b8 [8];
  undefined8 local_398;
  undefined8 local_390;
  undefined8 local_388;
  undefined8 local_378;
  undefined8 local_368;
  undefined8 local_358;
  undefined8 local_348;
  undefined8 local_338;
  undefined8 local_328;
  undefined8 local_318;
  long local_308;
  SendInstruction *RespInstr_2;
  SendInstruction *RespInstr_1;
  SendInstruction *RespInstr;
  char *resp;
  UpnpExtraHeaders *extra;
  UpnpListHead *head;
  UpnpListIter pos;
  char *pcStack_2c8;
  int rc;
  char *month_str;
  char *weekday_str;
  char tempbuf [200];
  uint local_1e8;
  va_list argp;
  int error_code;
  uri_type *uri_ptr;
  uri_type url;
  char *temp_str;
  char *url_str;
  char *method_str;
  http_method_t method;
  char *status_msg;
  char *pcStack_c0;
  int status_code;
  char *end_str;
  char *start_str;
  tm *date;
  tm date_storage;
  time_t curr_time;
  time_t *loc_time;
  size_t length;
  off_t bignum;
  size_t num;
  char *s;
  char *pcStack_38;
  char c;
  char *fmt_local;
  int http_minor_version_local;
  int http_major_version_local;
  membuffer *buf_local;
  
  if (in_AL != '\0') {
    local_388 = in_XMM0_Qa;
    local_378 = in_XMM1_Qa;
    local_368 = in_XMM2_Qa;
    local_358 = in_XMM3_Qa;
    local_348 = in_XMM4_Qa;
    local_338 = in_XMM5_Qa;
    local_328 = in_XMM6_Qa;
    local_318 = in_XMM7_Qa;
  }
  argp[0].reg_save_area._4_4_ = 0;
  month_str = "Sun";
  pcStack_2c8 = "Jan";
  pos._4_4_ = 0;
  local_398 = in_R8;
  local_390 = in_R9;
  memset(&weekday_str,0,200);
  argp[0]._0_8_ = &stack0x00000008;
  local_1e8 = 0x20;
  pcStack_38 = fmt;
LAB_00113f0a:
  do {
    while( true ) {
      uVar12 = (undefined4)((ulong)in_stack_fffffffffffff9c8 >> 0x20);
      uVar10 = (undefined4)(in_stack_fffffffffffff9b8 >> 0x20);
      uVar9 = (undefined4)((ulong)in_stack_fffffffffffff9b0 >> 0x20);
      uVar13 = (undefined4)((ulong)in_stack_fffffffffffff9d0 >> 0x20);
      uVar11 = (undefined4)((ulong)in_stack_fffffffffffff9c0 >> 0x20);
      pcVar8 = pcStack_38 + 1;
      cVar1 = *pcStack_38;
      if (cVar1 == '\0') {
        return 0;
      }
      pcStack_38 = pcVar8;
      if (cVar1 != 'E') break;
      if (local_1e8 < 0x29) {
        local_3d0 = (undefined8 *)((long)local_3b8 + (long)(int)local_1e8);
        local_1e8 = local_1e8 + 8;
      }
      else {
        local_3d0 = (undefined8 *)argp[0]._0_8_;
        argp[0]._0_8_ = argp[0]._0_8_ + 8;
      }
      extra = (UpnpExtraHeaders *)*local_3d0;
      if (extra != (UpnpExtraHeaders *)0x0) {
        for (head = UpnpListBegin((UpnpListHead *)extra); pUVar3 = head,
            pUVar5 = UpnpListEnd(&extra->m_node), pUVar3 != pUVar5;
            head = UpnpListNext(&extra->m_node,head)) {
          resp = (char *)head;
          __s = (SendInstruction *)UpnpExtraHeaders_get_resp((UpnpExtraHeaders *)head);
          RespInstr = __s;
          if (__s != (SendInstruction *)0x0) {
            sVar6 = strlen((char *)__s);
            iVar4 = membuffer_append(buf,__s,sVar6);
            if ((iVar4 != 0) || (iVar4 = membuffer_append(buf,"\r\n",2), iVar4 != 0))
            goto LAB_00115444;
          }
        }
      }
    }
    if (cVar1 == 's') {
      if (local_1e8 < 0x29) {
        local_400 = (undefined8 *)((long)local_3b8 + (long)(int)local_1e8);
        local_1e8 = local_1e8 + 8;
      }
      else {
        local_400 = (undefined8 *)argp[0]._0_8_;
        argp[0]._0_8_ = argp[0]._0_8_ + 8;
      }
      pcVar8 = (char *)*local_400;
      if (pcVar8 == (char *)0x0) {
        __assert_fail("s",".upnp/src/genlib/net/http/httpreadwrite.c",0x6be,
                      "int http_MakeMessage(membuffer *, int, int, const char *, ...)");
      }
      UpnpPrintf(UPNP_ALL,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x6c2,
                 "Adding a string : %s\n",pcVar8);
      sVar6 = strlen(pcVar8);
      iVar4 = membuffer_append(buf,pcVar8,sVar6);
    }
    else if (cVar1 == 'K') {
      iVar4 = membuffer_append_str(buf,"TRANSFER-ENCODING: chunked\r\n");
    }
    else if (cVar1 == 'A') {
      if (local_1e8 < 0x29) {
        local_428 = (long *)((long)local_3b8 + (long)(int)local_1e8);
        local_1e8 = local_1e8 + 8;
      }
      else {
        local_428 = (long *)argp[0]._0_8_;
        argp[0]._0_8_ = argp[0]._0_8_ + 8;
      }
      RespInstr_1 = (SendInstruction *)*local_428;
      if (RespInstr_1 == (SendInstruction *)0x0) {
        __assert_fail("RespInstr",".upnp/src/genlib/net/http/httpreadwrite.c",0x6d2,
                      "int http_MakeMessage(membuffer *, int, int, const char *, ...)");
      }
      if ((RespInstr_1->CorsHeader == (void *)0x0) ||
         (iVar4 = strcmp((char *)RespInstr_1->CorsHeader,""), iVar4 == 0)) goto LAB_00113f0a;
      iVar4 = http_MakeMessage(buf,http_major_version,http_minor_version,"ssc",
                               "Access-Control-Allow-Origin: ",RespInstr_1->CorsHeader);
    }
    else if (cVar1 == 'G') {
      if (local_1e8 < 0x29) {
        local_440 = (long *)((long)local_3b8 + (long)(int)local_1e8);
        local_1e8 = local_1e8 + 8;
      }
      else {
        local_440 = (long *)argp[0]._0_8_;
        argp[0]._0_8_ = argp[0]._0_8_ + 8;
      }
      RespInstr_2 = (SendInstruction *)*local_440;
      if (RespInstr_2 == (SendInstruction *)0x0) {
        __assert_fail("RespInstr",".upnp/src/genlib/net/http/httpreadwrite.c",0x6e1,
                      "int http_MakeMessage(membuffer *, int, int, const char *, ...)");
      }
      pcVar8 = RespInstr_2->RangeHeader;
      sVar6 = strlen(RespInstr_2->RangeHeader);
      iVar4 = membuffer_append(buf,pcVar8,sVar6);
    }
    else if (cVar1 == 'b') {
      if (local_1e8 < 0x29) {
        local_468 = (undefined8 *)((long)local_3b8 + (long)(int)local_1e8);
        local_1e8 = local_1e8 + 8;
      }
      else {
        local_468 = (undefined8 *)argp[0]._0_8_;
        argp[0]._0_8_ = argp[0]._0_8_ + 8;
      }
      pcVar8 = (char *)*local_468;
      UpnpPrintf(UPNP_ALL,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x6ed,
                 "Adding a char Buffer starting with: %c\n",(ulong)(uint)(int)*pcVar8);
      if (pcVar8 == (char *)0x0) {
        __assert_fail("s",".upnp/src/genlib/net/http/httpreadwrite.c",0x6f0,
                      "int http_MakeMessage(membuffer *, int, int, const char *, ...)");
      }
      if (local_1e8 < 0x29) {
        local_480 = (size_t *)((long)local_3b8 + (long)(int)local_1e8);
        local_1e8 = local_1e8 + 8;
      }
      else {
        local_480 = (size_t *)argp[0]._0_8_;
        argp[0]._0_8_ = argp[0]._0_8_ + 8;
      }
      iVar4 = membuffer_append(buf,pcVar8,*local_480);
    }
    else if (cVar1 == 'c') {
      iVar4 = membuffer_append(buf,"\r\n",2);
    }
    else if (cVar1 == 'd') {
      if (local_1e8 < 0x29) {
        local_498 = (int *)((long)local_3b8 + (long)(int)local_1e8);
        local_1e8 = local_1e8 + 8;
      }
      else {
        local_498 = (int *)argp[0]._0_8_;
        argp[0]._0_8_ = argp[0]._0_8_ + 8;
      }
      pos._4_4_ = snprintf((char *)&weekday_str,200,"%zu",(long)*local_498);
      if (((int)pos._4_4_ < 0) || (199 < pos._4_4_)) goto LAB_00115444;
      sVar6 = strlen((char *)&weekday_str);
      iVar4 = membuffer_append(buf,&weekday_str,sVar6);
    }
    else if (cVar1 == 'h') {
      if (local_1e8 < 0x29) {
        local_4c0 = (undefined8 *)((long)local_3b8 + (long)(int)local_1e8);
        local_1e8 = local_1e8 + 8;
      }
      else {
        local_4c0 = (undefined8 *)argp[0]._0_8_;
        argp[0]._0_8_ = argp[0]._0_8_ + 8;
      }
      pos._4_4_ = snprintf((char *)&weekday_str,200,"%ld",*local_4c0);
      if (((int)pos._4_4_ < 0) || (199 < pos._4_4_)) goto LAB_00115444;
      sVar6 = strlen((char *)&weekday_str);
      iVar4 = membuffer_append(buf,&weekday_str,sVar6);
    }
    else if ((cVar1 == 't') || (cVar1 == 'D')) {
      if (cVar1 == 'D') {
        end_str = "DATE: ";
        pcStack_c0 = "\r\n";
        date_storage.tm_zone = (char *)time((time_t *)0x0);
        curr_time = (time_t)&date_storage.tm_zone;
      }
      else {
        pcStack_c0 = "";
        end_str = "";
        if (local_1e8 < 0x29) {
          local_4e8 = (time_t *)((long)local_3b8 + (long)(int)local_1e8);
          local_1e8 = local_1e8 + 8;
        }
        else {
          local_4e8 = (time_t *)argp[0]._0_8_;
          argp[0]._0_8_ = argp[0]._0_8_ + 8;
        }
        curr_time = *local_4e8;
      }
      if (curr_time == 0) {
        __assert_fail("loc_time",".upnp/src/genlib/net/http/httpreadwrite.c",0x716,
                      "int http_MakeMessage(membuffer *, int, int, const char *, ...)");
      }
      ptVar7 = gmtime_r((time_t *)curr_time,(tm *)&date);
      if (ptVar7 == (tm *)0x0) goto LAB_00115444;
      in_stack_fffffffffffff9b0 = CONCAT44(uVar9,ptVar7->tm_year + 0x76c);
      in_stack_fffffffffffff9b8 = CONCAT44(uVar10,ptVar7->tm_hour);
      in_stack_fffffffffffff9c0 = (char *)CONCAT44(uVar11,ptVar7->tm_min);
      in_stack_fffffffffffff9c8 = CONCAT44(uVar12,ptVar7->tm_sec);
      pos._4_4_ = snprintf((char *)&weekday_str,200,"%s%s, %02d %s %d %02d:%02d:%02d GMT%s",end_str,
                           month_str + (ptVar7->tm_wday << 2),(ulong)(uint)ptVar7->tm_mday,
                           pcStack_2c8 + (ptVar7->tm_mon << 2),in_stack_fffffffffffff9b0,
                           in_stack_fffffffffffff9b8,in_stack_fffffffffffff9c0,
                           in_stack_fffffffffffff9c8,pcStack_c0);
      if (((int)pos._4_4_ < 0) || (199 < pos._4_4_)) goto LAB_00115444;
      sVar6 = strlen((char *)&weekday_str);
      iVar4 = membuffer_append(buf,&weekday_str,sVar6);
      in_stack_fffffffffffff9d0 = pcStack_c0;
    }
    else {
      if (cVar1 == 'L') {
        if (local_1e8 < 0x29) {
          local_510 = (long *)((long)local_3b8 + (long)(int)local_1e8);
          local_1e8 = local_1e8 + 8;
        }
        else {
          local_510 = (long *)argp[0]._0_8_;
          argp[0]._0_8_ = argp[0]._0_8_ + 8;
        }
        local_308 = *local_510;
        if (local_308 == 0) {
          __assert_fail("RespInstr",".upnp/src/genlib/net/http/httpreadwrite.c",0x731,
                        "int http_MakeMessage(membuffer *, int, int, const char *, ...)");
        }
        strcmp((char *)(local_308 + 0xd8),"");
        goto LAB_00113f0a;
      }
      if (cVar1 == 'C') {
        if ((http_major_version < 2) && ((http_major_version != 1 || (http_minor_version != 1))))
        goto LAB_00113f0a;
        iVar4 = membuffer_append_str(buf,"CONNECTION: close\r\n");
      }
      else if (cVar1 == 'N') {
        if (local_1e8 < 0x29) {
          local_528 = (long *)((long)local_3b8 + (long)(int)local_1e8);
          local_1e8 = local_1e8 + 8;
        }
        else {
          local_528 = (long *)argp[0]._0_8_;
          argp[0]._0_8_ = argp[0]._0_8_ + 8;
        }
        if (*local_528 < 0) {
          __assert_fail("bignum >= 0",".upnp/src/genlib/net/http/httpreadwrite.c",0x747,
                        "int http_MakeMessage(membuffer *, int, int, const char *, ...)");
        }
        iVar4 = http_MakeMessage(buf,http_major_version,http_minor_version,"shc","CONTENT-LENGTH: ",
                                 *local_528);
        if (iVar4 != 0) goto LAB_00115444;
        iVar4 = http_MakeMessage(buf,http_major_version,http_minor_version,"sc",
                                 "Accept-Ranges: bytes");
      }
      else if ((cVar1 == 'S') || (cVar1 == 'U')) {
        pcVar8 = "USER-AGENT: ";
        if (cVar1 == 'S') {
          pcVar8 = "SERVER: ";
        }
        url.hostport.IPaddress.__ss_align = (unsigned_long)pcVar8;
        get_sdk_info((char *)&weekday_str,200);
        iVar4 = http_MakeMessage(buf,http_major_version,http_minor_version,"ss",
                                 url.hostport.IPaddress.__ss_align,&weekday_str);
      }
      else if (cVar1 == 'X') {
        if (local_1e8 < 0x29) {
          local_540 = (undefined8 *)((long)local_3b8 + (long)(int)local_1e8);
          local_1e8 = local_1e8 + 8;
        }
        else {
          local_540 = (undefined8 *)argp[0]._0_8_;
          argp[0]._0_8_ = argp[0]._0_8_ + 8;
        }
        pcVar8 = (char *)*local_540;
        if (pcVar8 == (char *)0x0) {
          __assert_fail("s",".upnp/src/genlib/net/http/httpreadwrite.c",0x764,
                        "int http_MakeMessage(membuffer *, int, int, const char *, ...)");
        }
        iVar4 = membuffer_append_str(buf,"X-User-Agent: ");
        if (iVar4 != 0) goto LAB_00115444;
        sVar6 = strlen(pcVar8);
        iVar4 = membuffer_append(buf,pcVar8,sVar6);
      }
      else if (cVar1 == 'R') {
        if (local_1e8 < 0x29) {
          local_568 = (uint *)((long)local_3b8 + (long)(int)local_1e8);
          local_1e8 = local_1e8 + 8;
        }
        else {
          local_568 = (uint *)argp[0]._0_8_;
          argp[0]._0_8_ = argp[0]._0_8_ + 8;
        }
        uVar2 = *local_568;
        if ((int)uVar2 < 1) {
          __assert_fail("status_code > 0",".upnp/src/genlib/net/http/httpreadwrite.c",0x76d,
                        "int http_MakeMessage(membuffer *, int, int, const char *, ...)");
        }
        pos._4_4_ = snprintf((char *)&weekday_str,200,"HTTP/%d.%d %d ",
                             (ulong)(uint)http_major_version,(ulong)(uint)http_minor_version,
                             (ulong)uVar2);
        pcVar8 = http_get_code_text(uVar2);
        if (((int)pos._4_4_ < 0) || (199 < pos._4_4_)) goto LAB_00115444;
        iVar4 = http_MakeMessage(buf,http_major_version,http_minor_version,"ssc",&weekday_str,pcVar8
                                );
      }
      else if (cVar1 == 'B') {
        if (local_1e8 < 0x29) {
          local_580 = (uint *)((long)local_3b8 + (long)(int)local_1e8);
          local_1e8 = local_1e8 + 8;
        }
        else {
          local_580 = (uint *)argp[0]._0_8_;
          argp[0]._0_8_ = argp[0]._0_8_ + 8;
        }
        uVar2 = *local_580;
        pcVar8 = http_get_code_text(uVar2);
        pos._4_4_ = snprintf((char *)&weekday_str,200,"%s%d %s%s","<html><body><h1>",(ulong)uVar2,
                             pcVar8,"</h1></body></html>");
        if (((int)pos._4_4_ < 0) || (199 < pos._4_4_)) goto LAB_00115444;
        sVar6 = strlen((char *)&weekday_str);
        iVar4 = http_MakeMessage(buf,http_major_version,http_minor_version,"NTcs",sVar6,"text/html",
                                 &weekday_str);
      }
      else if (cVar1 == 'Q') {
        if (local_1e8 < 0x29) {
          local_5a8 = (http_method_t *)((long)local_3b8 + (long)(int)local_1e8);
          local_1e8 = local_1e8 + 8;
        }
        else {
          local_5a8 = (http_method_t *)argp[0]._0_8_;
          argp[0]._0_8_ = argp[0]._0_8_ + 8;
        }
        pcVar8 = method_to_str(*local_5a8);
        if (local_1e8 < 0x29) {
          local_5c0 = (undefined8 *)((long)local_3b8 + (long)(int)local_1e8);
          local_1e8 = local_1e8 + 8;
        }
        else {
          local_5c0 = (undefined8 *)argp[0]._0_8_;
          argp[0]._0_8_ = argp[0]._0_8_ + 8;
        }
        if (local_1e8 < 0x29) {
          local_5d8 = (undefined8 *)((long)local_3b8 + (long)(int)local_1e8);
          local_1e8 = local_1e8 + 8;
        }
        else {
          local_5d8 = (undefined8 *)argp[0]._0_8_;
          argp[0]._0_8_ = argp[0]._0_8_ + 8;
        }
        in_stack_fffffffffffff9b0 = *local_5d8;
        in_stack_fffffffffffff9b8 = 0;
        in_stack_fffffffffffff9c0 = (char *)CONCAT44(uVar11,http_major_version);
        in_stack_fffffffffffff9c8 = 0;
        in_stack_fffffffffffff9d0 = (char *)CONCAT44(uVar13,http_minor_version);
        iVar4 = http_MakeMessage(buf,http_major_version,http_minor_version,"ssbsdsdc",pcVar8," ",
                                 *local_5c0,in_stack_fffffffffffff9b0," HTTP/",
                                 in_stack_fffffffffffff9c0,".",in_stack_fffffffffffff9d0);
      }
      else if (cVar1 == 'q') {
        if (local_1e8 < 0x29) {
          local_5f0 = (uint *)((long)local_3b8 + (long)(int)local_1e8);
          local_1e8 = local_1e8 + 8;
        }
        else {
          local_5f0 = (uint *)argp[0]._0_8_;
          argp[0]._0_8_ = argp[0]._0_8_ + 8;
        }
        uVar2 = *local_5f0;
        if (local_1e8 < 0x29) {
          local_608 = (undefined8 *)((long)local_3b8 + (long)(int)local_1e8);
          local_1e8 = local_1e8 + 8;
        }
        else {
          local_608 = (undefined8 *)argp[0]._0_8_;
          argp[0]._0_8_ = argp[0]._0_8_ + 8;
        }
        if ((uri_type *)*local_608 == (uri_type *)0x0) {
          __assert_fail("uri_ptr",".upnp/src/genlib/net/http/httpreadwrite.c",0x7ad,
                        "int http_MakeMessage(membuffer *, int, int, const char *, ...)");
        }
        iVar4 = http_FixUrl((uri_type *)*local_608,(uri_type *)&uri_ptr);
        if (iVar4 != 0) {
          argp[0].reg_save_area._4_4_ = -0x6c;
          goto LAB_00115444;
        }
        in_stack_fffffffffffff9b0 = 0;
        in_stack_fffffffffffff9b8 = url.fragment.size;
        in_stack_fffffffffffff9c0 = url.hostport.text.buff;
        iVar4 = http_MakeMessage(buf,http_major_version,http_minor_version,"Qsbc",(ulong)uVar2,
                                 url._24_8_,url.pathquery.buff,"HOST: ",url.fragment.size,
                                 url.hostport.text.buff);
      }
      else {
        if (cVar1 != 'T') {
          __assert_fail("0",".upnp/src/genlib/net/http/httpreadwrite.c",0x7ca,
                        "int http_MakeMessage(membuffer *, int, int, const char *, ...)");
        }
        if (local_1e8 < 0x29) {
          local_620 = (unsigned_long *)((long)local_3b8 + (long)(int)local_1e8);
          local_1e8 = local_1e8 + 8;
        }
        else {
          local_620 = (unsigned_long *)argp[0]._0_8_;
          argp[0]._0_8_ = argp[0]._0_8_ + 8;
        }
        url.hostport.IPaddress.__ss_align = *local_620;
        iVar4 = http_MakeMessage(buf,http_major_version,http_minor_version,"ssc","CONTENT-TYPE: ",
                                 url.hostport.IPaddress.__ss_align);
      }
    }
    if (iVar4 != 0) {
LAB_00115444:
      if (argp[0].reg_save_area._4_4_ == 0) {
        argp[0].reg_save_area._4_4_ = -0x68;
      }
      membuffer_destroy(buf);
      return argp[0].reg_save_area._4_4_;
    }
  } while( true );
}

Assistant:

int http_MakeMessage(membuffer *buf,
	int http_major_version,
	int http_minor_version,
	const char *fmt,
	...)
{
	char c;
	char *s = NULL;
	size_t num;
	off_t bignum;
	size_t length;
	time_t *loc_time;
	time_t curr_time;
	struct tm date_storage;
	struct tm *date;
	const char *start_str;
	const char *end_str;
	int status_code;
	const char *status_msg;
	http_method_t method;
	const char *method_str;
	const char *url_str;
	const char *temp_str;
	uri_type url;
	uri_type *uri_ptr;
	int error_code = 0;
	va_list argp;
	char tempbuf[200];
	const char *weekday_str = "Sun\0Mon\0Tue\0Wed\0Thu\0Fri\0Sat";
	const char *month_str = "Jan\0Feb\0Mar\0Apr\0May\0Jun\0"
				"Jul\0Aug\0Sep\0Oct\0Nov\0Dec";
	int rc = 0;

	memset(tempbuf, 0, sizeof(tempbuf));
	va_start(argp, fmt);
	while ((c = *fmt++)) {
		if (c == 'E') {
			/* list of extra headers */
			UpnpListIter pos;
			UpnpListHead *head;
			UpnpExtraHeaders *extra;
			const DOMString resp;
			head = (UpnpListHead *)va_arg(argp, UpnpListHead *);
			if (head) {
				for (pos = UpnpListBegin(head);
					pos != UpnpListEnd(head);
					pos = UpnpListNext(head, pos)) {
					extra = (UpnpExtraHeaders *)pos;
					resp = UpnpExtraHeaders_get_resp(extra);
					if (resp) {
						if (membuffer_append(buf,
							    resp,
							    strlen(resp)))
							goto error_handler;
						if (membuffer_append(buf,
							    "\r\n",
							    (size_t)2))
							goto error_handler;
					}
				}
			}
		} else if (c == 's') {
			/* C string */
			s = (char *)va_arg(argp, char *);
			assert(s);
			UpnpPrintf(UPNP_ALL,
				HTTP,
				__FILE__,
				__LINE__,
				"Adding a string : %s\n",
				s);
			if (membuffer_append(buf, s, strlen(s)))
				goto error_handler;
		} else if (c == 'K') {
			/* Add Chunky header */
			if (membuffer_append_str(
				    buf, "TRANSFER-ENCODING: chunked\r\n"))
				goto error_handler;
		} else if (c == 'A') {
			/* Add Access-Control-Allow-Origin header only if
			 * set by UpnpSetWebServerCorsString */
			struct SendInstruction *RespInstr;
			RespInstr = (struct SendInstruction *)va_arg(
				argp, struct SendInstruction *);
			assert(RespInstr);
			if (RespInstr->CorsHeader &&
				strcmp(RespInstr->CorsHeader, "") &&
				http_MakeMessage(buf,
					http_major_version,
					http_minor_version,
					"ssc",
					"Access-Control-Allow-Origin: ",
					RespInstr->CorsHeader) != 0)
				goto error_handler;
		} else if (c == 'G') {
			/* Add Range header */
			struct SendInstruction *RespInstr;
			RespInstr = (struct SendInstruction *)va_arg(
				argp, struct SendInstruction *);
			assert(RespInstr);
			/* connection header */
			if (membuffer_append(buf,
				    RespInstr->RangeHeader,
				    strlen(RespInstr->RangeHeader)))
				goto error_handler;
		} else if (c == 'b') {
			/* mem buffer */
			s = (char *)va_arg(argp, char *);
			UpnpPrintf(UPNP_ALL,
				HTTP,
				__FILE__,
				__LINE__,
				"Adding a char Buffer starting with: %c\n",
				(int)s[0]);
			assert(s);
			length = (size_t)va_arg(argp, size_t);
			if (membuffer_append(buf, s, length))
				goto error_handler;
		} else if (c == 'c') {
			/* crlf */
			if (membuffer_append(buf, "\r\n", (size_t)2))
				goto error_handler;
		} else if (c == 'd') {
			/* integer */
			num = (size_t)va_arg(argp, int);
			rc = snprintf(tempbuf, sizeof(tempbuf), "%" PRIzu, num);
			if (rc < 0 || (unsigned int)rc >= sizeof(tempbuf) ||
				membuffer_append(buf, tempbuf, strlen(tempbuf)))
				goto error_handler;
		} else if (c == 'h') {
			/* off_t */
			bignum = (off_t)va_arg(argp, off_t);
			rc = snprintf(tempbuf,
				sizeof(tempbuf),
				"%" PRId64,
				(int64_t)bignum);
			if (rc < 0 || (unsigned int)rc >= sizeof(tempbuf) ||
				membuffer_append(buf, tempbuf, strlen(tempbuf)))
				goto error_handler;
		} else if (c == 't' || c == 'D') {
			/* date */
			if (c == 'D') {
				/* header */
				start_str = "DATE: ";
				end_str = "\r\n";
				curr_time = time(NULL);
				loc_time = &curr_time;
			} else {
				/* date value only */
				start_str = end_str = "";
				loc_time = (time_t *)va_arg(argp, time_t *);
			}
			assert(loc_time);
			date = http_gmtime_r(loc_time, &date_storage);
			if (date == NULL)
				goto error_handler;
			rc = snprintf(tempbuf,
				sizeof(tempbuf),
				"%s%s, %02d %s %d %02d:%02d:%02d GMT%s",
				start_str,
				&weekday_str[date->tm_wday * 4],
				date->tm_mday,
				&month_str[date->tm_mon * 4],
				date->tm_year + 1900,
				date->tm_hour,
				date->tm_min,
				date->tm_sec,
				end_str);
			if (rc < 0 || (unsigned int)rc >= sizeof(tempbuf) ||
				membuffer_append(buf, tempbuf, strlen(tempbuf)))
				goto error_handler;
		} else if (c == 'L') {
			/* Add CONTENT-LANGUAGE header only if
			 * WEB_SERVER_CONTENT_LANGUAGE */
			/* is not empty and if Accept-Language header is not
			 * empty */
			struct SendInstruction *RespInstr;
			RespInstr = (struct SendInstruction *)va_arg(
				argp, struct SendInstruction *);
			assert(RespInstr);
			if (strcmp(RespInstr->AcceptLanguageHeader, "") &&
				strcmp(WEB_SERVER_CONTENT_LANGUAGE, "") &&
				http_MakeMessage(buf,
					http_major_version,
					http_minor_version,
					"ssc",
					"CONTENT-LANGUAGE: ",
					WEB_SERVER_CONTENT_LANGUAGE) != 0)
				goto error_handler;
		} else if (c == 'C') {
			if ((http_major_version > 1) ||
				(http_major_version == 1 &&
					http_minor_version == 1)) {
				/* connection header */
				if (membuffer_append_str(
					    buf, "CONNECTION: close\r\n"))
					goto error_handler;
			}
		} else if (c == 'N') {
			/* content-length header */
			bignum = (off_t)va_arg(argp, off_t);
			assert(bignum >= 0);
			if (http_MakeMessage(buf,
				    http_major_version,
				    http_minor_version,
				    "shc",
				    "CONTENT-LENGTH: ",
				    bignum) != 0)
				goto error_handler;
			/* Add accept ranges */
			if (http_MakeMessage(buf,
				    http_major_version,
				    http_minor_version,
				    "sc",
				    "Accept-Ranges: bytes") != 0)
				goto error_handler;
		} else if (c == 'S' || c == 'U') {
			/* SERVER or USER-AGENT header */
			temp_str = (c == 'S') ? "SERVER: " : "USER-AGENT: ";
			get_sdk_info(tempbuf, sizeof(tempbuf));
			if (http_MakeMessage(buf,
				    http_major_version,
				    http_minor_version,
				    "ss",
				    temp_str,
				    tempbuf) != 0)
				goto error_handler;
		} else if (c == 'X') {
			/* C string */
			s = (char *)va_arg(argp, char *);
			assert(s);
			if (membuffer_append_str(buf, "X-User-Agent: ") != 0)
				goto error_handler;
			if (membuffer_append(buf, s, strlen(s)) != 0)
				goto error_handler;
		} else if (c == 'R') {
			/* response start line */
			/*   e.g.: 'HTTP/1.1 200 OK' code */
			status_code = (int)va_arg(argp, int);
			assert(status_code > 0);
			rc = snprintf(tempbuf,
				sizeof(tempbuf),
				"HTTP/%d.%d %d ",
				http_major_version,
				http_minor_version,
				status_code);
			/* str */
			status_msg = http_get_code_text(status_code);
			if (rc < 0 || (unsigned int)rc >= sizeof(tempbuf) ||
				http_MakeMessage(buf,
					http_major_version,
					http_minor_version,
					"ssc",
					tempbuf,
					status_msg) != 0)
				goto error_handler;
		} else if (c == 'B') {
			/* body of a simple reply */
			status_code = (int)va_arg(argp, int);
			rc = snprintf(tempbuf,
				sizeof(tempbuf),
				"%s%d %s%s",
				"<html><body><h1>",
				status_code,
				http_get_code_text(status_code),
				"</h1></body></html>");
			if (rc < 0 || (unsigned int)rc >= sizeof(tempbuf))
				goto error_handler;
			bignum = (off_t)strlen(tempbuf);
			if (http_MakeMessage(buf,
				    http_major_version,
				    http_minor_version,
				    "NTcs",
				    bignum,	  /* content-length */
				    "text/html",  /* content-type */
				    tempbuf) != 0 /* body */
			)
				goto error_handler;
		} else if (c == 'Q') {
			/* request start line */
			/* GET /foo/bar.html HTTP/1.1\r\n */
			method = (http_method_t)va_arg(argp, http_method_t);
			method_str = method_to_str(method);
			url_str = (const char *)va_arg(argp, const char *);
			num = (size_t)va_arg(
				argp, size_t); /* length of url_str */
			if (http_MakeMessage(buf,
				    http_major_version,
				    http_minor_version,
				    "ssbsdsdc",
				    method_str, /* method */
				    " ",
				    url_str,
				    num, /* url */
				    " HTTP/",
				    http_major_version,
				    ".",
				    http_minor_version) != 0)
				goto error_handler;
		} else if (c == 'q') {
			/* request start line and HOST header */
			method = (http_method_t)va_arg(argp, http_method_t);
			uri_ptr = (uri_type *)va_arg(argp, uri_type *);
			assert(uri_ptr);
			if (http_FixUrl(uri_ptr, &url) != 0) {
				error_code = UPNP_E_INVALID_URL;
				goto error_handler;
			}
			if (http_MakeMessage(buf,
				    http_major_version,
				    http_minor_version,
				    "Q"
				    "sbc",
				    method,
				    url.pathquery.buff,
				    url.pathquery.size,
				    "HOST: ",
				    url.hostport.text.buff,
				    url.hostport.text.size) != 0)
				goto error_handler;
		} else if (c == 'T') {
			/* content type header */
			temp_str = (const char *)va_arg(
				argp, const char *); /* type/subtype format */
			if (http_MakeMessage(buf,
				    http_major_version,
				    http_minor_version,
				    "ssc",
				    "CONTENT-TYPE: ",
				    temp_str) != 0)
				goto error_handler;
		} else {
			assert(0);
		}
	}
	goto ExitFunction;

error_handler:
	/* Default is out of memory error. */
	if (!error_code)
		error_code = UPNP_E_OUTOF_MEMORY;
	membuffer_destroy(buf);

ExitFunction:
	va_end(argp);
	return error_code;
}